

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O3

bool ONX_Model::GetRDKEmbeddedFilePaths(ONX_Model_UserData *docud,ON_ClassArray<ON_wString> *paths)

{
  bool bVar1;
  int iVar2;
  ON_Read3dmBufferArchive archive;
  ON_wString OStack_268;
  ON_Read3dmBufferArchive local_260;
  
  bVar1 = ::IsRDKDocumentInformation(docud);
  if (bVar1) {
    ON_Read3dmBufferArchive::ON_Read3dmBufferArchive
              (&local_260,(long)(docud->m_goo).m_value,(docud->m_goo).m_goo,false,
               docud->m_usertable_3dm_version,docud->m_usertable_opennurbs_version);
    iVar2 = SeekArchiveToEmbeddedFiles(&local_260,(docud->m_goo).m_value);
    if (iVar2 == 0) {
LAB_0046969c:
      bVar1 = false;
    }
    else {
      if (0 < iVar2) {
        do {
          ON_wString::ON_wString(&OStack_268);
          bVar1 = ON_BinaryArchive::ReadString(&local_260.super_ON_BinaryArchive,&OStack_268);
          if (!bVar1) {
            ON_wString::~ON_wString(&OStack_268);
            goto LAB_0046969c;
          }
          ON_ClassArray<ON_wString>::Append(paths,&OStack_268);
          SeekArchivePastCompressedBuffer(&local_260.super_ON_BinaryArchive);
          ON_wString::~ON_wString(&OStack_268);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      bVar1 = 0 < paths->m_count;
    }
    ON_Read3dmBufferArchive::~ON_Read3dmBufferArchive(&local_260);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ONX_Model::GetRDKEmbeddedFilePaths(const ONX_Model_UserData& docud, ON_ClassArray<ON_wString>& paths)
{
  if (!::IsRDKDocumentInformation(docud))
    return false;

  ON_Read3dmBufferArchive archive(docud.m_goo.m_value, docud.m_goo.m_goo, false, docud.m_usertable_3dm_version, docud.m_usertable_opennurbs_version);

  const int count = SeekArchiveToEmbeddedFiles(archive, docud.m_goo.m_value);
  if (!ReadEmbeddedFilePathsFromArchive(archive, count, paths))
    return false;

  return true;
}